

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double fstat_pq2s(pqpair pq,double dofnum,double dofden)

{
  double local_68;
  double bound;
  double dfd;
  double dfn;
  double f;
  double q;
  double p;
  int status;
  int which;
  double dofden_local;
  double dofnum_local;
  pqpair pq_local;
  
  f = pq.q;
  q = pq.p;
  p._4_4_ = 2;
  if (0.0 < q) {
    if (0.0 < f) {
      dfn = 0.0;
      bound = dofden;
      dfd = dofnum;
      _status = dofden;
      dofden_local = dofnum;
      dofnum_local = q;
      pq_local.p = f;
      cdff((int *)((long)&p + 4),&q,&f,&dfn,&dfd,&bound,(int *)&p,&local_68);
      pq_local.q = dfn;
    }
    else {
      pq_local.q = 9.99e+37;
    }
  }
  else {
    pq_local.q = 0.0;
  }
  return pq_local.q;
}

Assistant:

static double fstat_pq2s( pqpair pq , double dofnum , double dofden )
{
   int which , status ;
   double p , q , f , dfn , dfd , bound ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return 0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return BIGG ;
   f      = 0.0 ;
   dfn    = dofnum ;
   dfd    = dofden ;

   cdff( &which , &p , &q , &f , &dfn , &dfd , &status , &bound ) ;
   return f ;
}